

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool slang::ast::checkAssertionArg
               (PropertyExprSyntax *propExpr,AssertionPortSymbol *formal,ASTContext *context,
               ActualArg *result,bool isRecursiveProp)

{
  SourceRange rangeOverride;
  Expression *pEVar1;
  bool bVar2;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> _Var3;
  int iVar4;
  __tuple_element_t<0UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_> *ppSVar5;
  ParenthesizedExpressionSyntax *pPVar6;
  Type *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Diagnostic *pDVar8;
  undefined4 extraout_var_04;
  ValueSymbol *this;
  Scope *this_00;
  Symbol *pSVar9;
  socklen_t __len;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> local_1d9;
  Expression *local_1b0;
  SourceRange local_1a8;
  bitmask<slang::ast::AssignFlags> local_194;
  SourceLocation local_190;
  SourceLocation local_188;
  undefined4 local_17c;
  Symbol *local_178;
  Symbol *sym;
  SourceRange local_168;
  DiagCode local_154;
  bitmask<slang::ast::ASTFlags> local_150;
  Expression *local_148;
  Expression *bound;
  DiagCode local_12c;
  TimingControl *local_128;
  TimingControl *local_120;
  TimingControl *bound_5;
  TimingControl *local_110;
  AssertionExpr *bound_4;
  AssertionExpr *local_100;
  AssertionExpr *bound_3;
  DiagCode local_e4;
  AssertionExpr *local_e0;
  AssertionExpr *local_d8;
  AssertionExpr *bound_2;
  Expression *local_c8;
  bitmask<slang::ast::ASTFlags> local_c0;
  Expression *local_b8;
  Expression *bound_1;
  Type *type;
  Symbol *local_a0;
  type expr;
  undefined1 local_90 [8];
  ASTContext ctx;
  type *regExpr;
  type *seqExpr;
  byte local_31;
  variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
  *pvStack_30;
  bool isRecursiveProp_local;
  ActualArg *result_local;
  ASTContext *context_local;
  AssertionPortSymbol *formal_local;
  PropertyExprSyntax *propExpr_local;
  
  local_31 = isRecursiveProp;
  pvStack_30 = (variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                *)result;
  result_local = (ActualArg *)context;
  context_local = (ASTContext *)formal;
  formal_local = (AssertionPortSymbol *)propExpr;
  decomposePropExpr((ast *)&seqExpr,propExpr);
  ppSVar5 = std::
            get<0ul,slang::syntax::SequenceExprSyntax_const*,slang::syntax::ExpressionSyntax_const*>
                      ((tuple<const_slang::syntax::SequenceExprSyntax_*,_const_slang::syntax::ExpressionSyntax_*>
                        *)&seqExpr);
  ctx.assertionInstance =
       (AssertionInstanceDetails *)
       std::get<1ul,slang::syntax::SequenceExprSyntax_const*,slang::syntax::ExpressionSyntax_const*>
                 ((tuple<const_slang::syntax::SequenceExprSyntax_*,_const_slang::syntax::ExpressionSyntax_*>
                   *)&seqExpr);
  memcpy(local_90,result_local,0x38);
  if ((local_31 & 1) != 0) {
    bVar2 = AssertionPortSymbol::isLocalVar((AssertionPortSymbol *)context_local);
    if (!bVar2) {
      if ((ctx.assertionInstance)->symbol == (Symbol *)0x0) {
        bitmask<slang::ast::ASTFlags>::bitmask
                  ((bitmask<slang::ast::ASTFlags> *)&expr,RecursivePropertyArg);
        bitmask<slang::ast::ASTFlags>::operator|=
                  ((bitmask<slang::ast::ASTFlags> *)&ctx.lookupIndex,
                   (bitmask<slang::ast::ASTFlags> *)&expr);
      }
      else {
        local_a0 = (ctx.assertionInstance)->symbol;
        while( true ) {
          if (*(SyntaxKind *)&(local_a0->name)._M_len != ParenthesizedExpression) break;
          pPVar6 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>
                             ((SyntaxNode *)local_a0);
          local_a0 = (Symbol *)
                     not_null::operator_cast_to_ExpressionSyntax_((not_null *)&pPVar6->expression);
        }
        if (*(SyntaxKind *)&(local_a0->name)._M_len != IdentifierName) {
          bitmask<slang::ast::ASTFlags>::bitmask
                    ((bitmask<slang::ast::ASTFlags> *)&type,RecursivePropertyArg);
          bitmask<slang::ast::ASTFlags>::operator|=
                    ((bitmask<slang::ast::ASTFlags> *)&ctx.lookupIndex,
                     (bitmask<slang::ast::ASTFlags> *)&type);
        }
      }
    }
  }
  bound_1 = (Expression *)DeclaredType::getType((DeclaredType *)&context_local[1].lookupIndex);
  pTVar7 = Type::getCanonicalType((Type *)bound_1);
  switch((pTVar7->super_Symbol).kind) {
  case EventType:
    iVar4 = TimingControl::bind((int)formal_local,(sockaddr *)local_90,__len);
    local_128 = (TimingControl *)CONCAT44(extraout_var_03,iVar4);
    local_120 = local_128;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=(pvStack_30,&local_128);
    bVar2 = TimingControl::bad(local_120);
    propExpr_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
    break;
  default:
    if ((ctx.assertionInstance)->symbol == (Symbol *)0x0) {
      local_12c.subsystem = Expressions;
      local_12c.code = 2;
      _bound = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)formal_local);
      pDVar8 = ASTContext::addDiag((ASTContext *)local_90,local_12c,_bound);
      operator<<(pDVar8,(Type *)bound_1);
      propExpr_local._7_1_ = false;
    }
    else {
      pSVar9 = (ctx.assertionInstance)->symbol;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_150,None);
      iVar4 = Expression::bind((int)pSVar9,(sockaddr *)local_90,(socklen_t)local_150.m_bits);
      local_148 = (Expression *)CONCAT44(extraout_var_04,iVar4);
      bVar2 = Expression::bad(local_148);
      pEVar1 = bound_1;
      if (bVar2) {
        propExpr_local._7_1_ = false;
      }
      else {
        pTVar7 = not_null<const_slang::ast::Type_*>::operator*(&local_148->type);
        bVar2 = Type::isCastCompatible((Type *)pEVar1,pTVar7);
        if (bVar2) {
          sym._4_4_ = 2;
          _Var3 = std::operator==((optional<slang::ast::ArgumentDirection> *)
                                  &context_local[2].instanceOrProc,
                                  (ArgumentDirection *)((long)&sym + 4));
          local_1d9 = true;
          if (!_Var3) {
            sym._0_4_ = 1;
            local_1d9 = std::operator==((optional<slang::ast::ArgumentDirection> *)
                                        &context_local[2].instanceOrProc,(ArgumentDirection *)&sym);
          }
          if (local_1d9 != false) {
            local_178 = Expression::getSymbolReference(local_148,true);
            if ((local_178 == (Symbol *)0x0) || (local_178->kind != LocalAssertionVar)) {
              local_17c = 0x70007;
              local_190 = (local_148->sourceRange).startLoc;
              local_188 = (local_148->sourceRange).endLoc;
              ASTContext::addDiag((ASTContext *)local_90,(DiagCode)0x70007,local_148->sourceRange);
              return false;
            }
            this = Symbol::as<slang::ast::ValueSymbol>(local_178);
            pEVar1 = local_148;
            this_00 = not_null<const_slang::ast::Scope_*>::operator->
                                ((not_null<const_slang::ast::Scope_*> *)result_local);
            pSVar9 = Scope::asSymbol(this_00);
            bitmask<slang::ast::AssignFlags>::bitmask(&local_194,AssertionLocalVarFormalArg);
            SourceRange::SourceRange(&local_1a8);
            rangeOverride.endLoc = local_1a8.endLoc;
            rangeOverride.startLoc = local_1a8.startLoc;
            ValueSymbol::addDriver
                      (this,Procedural,pEVar1,pSVar9,local_194,rangeOverride,(EvalContext *)0x0);
          }
          local_1b0 = local_148;
          std::
          variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
          ::operator=(pvStack_30,&local_1b0);
          propExpr_local._7_1_ = true;
        }
        else {
          local_154.subsystem = Expressions;
          local_154.code = 3;
          local_168 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)formal_local);
          pDVar8 = ASTContext::addDiag((ASTContext *)local_90,local_154,local_168);
          pTVar7 = not_null<const_slang::ast::Type_*>::operator*(&local_148->type);
          pDVar8 = operator<<(pDVar8,pTVar7);
          operator<<(pDVar8,(Type *)bound_1);
          propExpr_local._7_1_ = false;
        }
      }
    }
    break;
  case UntypedType:
    if ((ctx.assertionInstance)->symbol == (Symbol *)0x0) {
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&bound_2,AssertionInstanceArgCheck);
      bitmask<slang::ast::ASTFlags>::operator|=
                ((bitmask<slang::ast::ASTFlags> *)&ctx.lookupIndex,
                 (bitmask<slang::ast::ASTFlags> *)&bound_2);
      iVar4 = AssertionExpr::bind((AssertionExpr *)formal_local,(int)local_90,(sockaddr *)0x0,0);
      local_e0 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar4);
      local_d8 = local_e0;
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=(pvStack_30,&local_e0);
      bVar2 = AssertionExpr::bad(local_d8);
      propExpr_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
    }
    else {
      pSVar9 = (ctx.assertionInstance)->symbol;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_c0,AllowUnboundedLiteral);
      iVar4 = Expression::bind((int)pSVar9,(sockaddr *)local_90,(socklen_t)local_c0.m_bits);
      local_c8 = (Expression *)CONCAT44(extraout_var,iVar4);
      local_b8 = local_c8;
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=(pvStack_30,&local_c8);
      bVar2 = Expression::bad(local_b8);
      propExpr_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
    }
    break;
  case SequenceType:
    if (*ppSVar5 ==
        (__tuple_element_t<0UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_>)0x0) {
      local_e4.subsystem = Expressions;
      local_e4.code = 4;
      _bound_3 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)formal_local);
      ASTContext::addDiag((ASTContext *)local_90,local_e4,_bound_3);
      propExpr_local._7_1_ = false;
    }
    else {
      iVar4 = AssertionExpr::bind((int)*ppSVar5,(sockaddr *)local_90,0);
      local_100 = (AssertionExpr *)CONCAT44(extraout_var_01,iVar4);
      bVar2 = AssertionExpr::bad(local_100);
      if (bVar2) {
        propExpr_local._7_1_ = false;
      }
      else {
        AssertionExpr::requireSequence(local_100,(ASTContext *)local_90);
        bound_4 = local_100;
        std::
        variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
        ::operator=(pvStack_30,&bound_4);
        propExpr_local._7_1_ = true;
      }
    }
    break;
  case PropertyType:
    iVar4 = AssertionExpr::bind((AssertionExpr *)formal_local,(int)local_90,(sockaddr *)0x0,0);
    bound_5 = (TimingControl *)CONCAT44(extraout_var_02,iVar4);
    local_110 = bound_5;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=(pvStack_30,(AssertionExpr **)&bound_5);
    bVar2 = AssertionExpr::bad((AssertionExpr *)local_110);
    propExpr_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
    break;
  case ErrorType:
    propExpr_local._7_1_ = false;
  }
  return propExpr_local._7_1_;
}

Assistant:

static bool checkAssertionArg(const PropertyExprSyntax& propExpr, const AssertionPortSymbol& formal,
                              const ASTContext& context,
                              AssertionInstanceExpression::ActualArg& result,
                              bool isRecursiveProp) {
    auto [seqExpr, regExpr] = decomposePropExpr(propExpr);

    ASTContext ctx = context;
    if (isRecursiveProp && !formal.isLocalVar()) {
        // For every recursive instance of property q in the declaration of property p,
        // each actual argument expression e of the instance must satisfy at least one
        // of the following conditions:
        // 1. e is itself a formal argument of p.
        // 2. No formal argument of p appears in e.
        // 3. e is bound to a local variable formal argument of q.
        if (!regExpr)
            ctx.flags |= ASTFlags::RecursivePropertyArg;
        else {
            auto expr = regExpr;
            while (expr->kind == SyntaxKind::ParenthesizedExpression)
                expr = expr->as<ParenthesizedExpressionSyntax>().expression;

            // This check filters out cases where the entire argument is a formal argument.
            if (expr->kind != SyntaxKind::IdentifierName)
                ctx.flags |= ASTFlags::RecursivePropertyArg;
        }
    }

    auto& type = formal.declaredType.getType();
    switch (type.getCanonicalType().kind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind here just so we notice things like
            // name resolution errors even if the argument ends up being unused in the
            // body of the sequence / property.
            if (regExpr) {
                auto& bound = Expression::bind(*regExpr, ctx, ASTFlags::AllowUnboundedLiteral);
                result = &bound;
                return !bound.bad();
            }
            else {
                ctx.flags |= ASTFlags::AssertionInstanceArgCheck;
                auto& bound = AssertionExpr::bind(propExpr, ctx);
                result = &bound;
                return !bound.bad();
            }
        case SymbolKind::SequenceType: {
            if (!seqExpr) {
                ctx.addDiag(diag::AssertionArgTypeSequence, propExpr.sourceRange());
                return false;
            }

            auto& bound = AssertionExpr::bind(*seqExpr, ctx);
            if (bound.bad())
                return false;

            bound.requireSequence(ctx);
            result = &bound;
            return true;
        }
        case SymbolKind::PropertyType: {
            auto& bound = AssertionExpr::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::EventType: {
            auto& bound = TimingControl::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::ErrorType:
            return false;
        default:
            break;
    }

    // For all other types, we need a normal expression that
    // is cast compatible with the target type.
    if (!regExpr) {
        ctx.addDiag(diag::AssertionArgNeedsRegExpr, propExpr.sourceRange()) << type;
        return false;
    }

    auto& bound = Expression::bind(*regExpr, ctx);
    if (bound.bad())
        return false;

    if (!type.isCastCompatible(*bound.type)) {
        ctx.addDiag(diag::AssertionArgTypeMismatch, propExpr.sourceRange()) << *bound.type << type;
        return false;
    }

    // Local var formals that are output or inout must bind only to another local var.
    if (formal.localVarDirection == ArgumentDirection::InOut ||
        formal.localVarDirection == ArgumentDirection::Out) {
        auto sym = bound.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar) {
            ctx.addDiag(diag::AssertionOutputLocalVar, bound.sourceRange);
            return false;
        }

        sym->as<ValueSymbol>().addDriver(DriverKind::Procedural, bound, context.scope->asSymbol(),
                                         AssignFlags::AssertionLocalVarFormalArg);
    }

    result = &bound;
    return true;
}